

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

Model * gvr::loadDepth(char *name,char *spath,bool verbose)

{
  float *pfVar1;
  pointer piVar2;
  pointer piVar3;
  uint *puVar4;
  double dVar5;
  double dVar6;
  uchar *puVar7;
  float fVar8;
  int iVar9;
  char cVar10;
  int i_1;
  int iVar11;
  int iVar12;
  ColoredMesh *this;
  uchar **ppuVar13;
  long *plVar14;
  long lVar15;
  undefined8 uVar16;
  Matrix33d *pMVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong extraout_RDX;
  long i_5;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar21;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  uchar ***pppuVar29;
  size_type sVar30;
  int valid;
  long lVar31;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar32;
  bool bVar33;
  double ret;
  float fVar34;
  float fVar35;
  float fVar36;
  vector<int,_std::allocator<int>_> line0;
  SVector<double,_3> ret_1;
  Vector2d p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  View view;
  vector<int,_std::allocator<int>_> line1;
  int local_1a8;
  float local_19c;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_198;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_138;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_130;
  undefined1 local_128 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_f8;
  uint local_c0;
  size_type local_b8;
  long local_b0;
  long *local_90;
  long *local_88;
  float local_80;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_78;
  long *local_40;
  long local_38;
  
  pIVar21 = &local_f8;
  gimage::View::View((View *)pIVar21);
  gimage::loadView((View *)pIVar21,name,spath,verbose);
  local_19c = local_80;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_198,name,(allocator *)&local_78);
  gutil::split((vector *)&local_118,(string *)&local_198,',',true);
  if ((long *)local_198._0_8_ != &local_198.height) {
    operator_delete((void *)local_198._0_8_);
  }
  if (0x20 < (ulong)((long)local_118.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_118.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar23 = 1;
    lVar31 = 0x20;
    do {
      iVar11 = std::__cxx11::string::compare
                         ((long)&((local_118.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar31,0,(char *)0x2);
      if (iVar11 == 0) {
        std::__cxx11::string::substr
                  ((ulong)&local_198,
                   (long)&((local_118.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar31);
        uVar16 = local_198._0_8_;
        dVar5 = atof((char *)local_198._0_8_);
        if ((long *)uVar16 != &local_198.height) {
          operator_delete((void *)uVar16);
        }
        local_19c = (float)dVar5;
      }
      uVar23 = uVar23 + 1;
      lVar31 = lVar31 + 0x20;
    } while (uVar23 < (ulong)((long)local_118.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_b0 < 1) {
    uVar23 = 0;
  }
  else {
    lVar31 = 0;
    uVar23 = 0;
    do {
      if (0 < (long)local_b8) {
        sVar30 = 0;
        do {
          bVar33 = (int)local_c0 < 1;
          if (0 < (int)local_c0) {
            if ((*(uint *)(*(long *)(*local_90 + lVar31 * 8) + sVar30 * 4) & 0x7fffffff) <
                0x7f800000) {
              uVar28 = 1;
              do {
                uVar26 = uVar28;
                if (local_c0 == uVar26) break;
                uVar28 = uVar26 + 1;
              } while ((*(uint *)(*(long *)(local_90[uVar26] + lVar31 * 8) + sVar30 * 4) &
                       0x7fffffff) < 0x7f800000);
              bVar33 = local_c0 <= uVar26;
            }
            else {
              bVar33 = false;
            }
          }
          uVar23 = (ulong)((int)uVar23 + (uint)bVar33);
          sVar30 = sVar30 + 1;
        } while (sVar30 != local_b8);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != local_b0);
  }
  if ((local_f8.width < 1) || (local_f8.height < 1)) {
    this = (ColoredMesh *)operator_new(0xc0);
    Mesh::Mesh((Mesh *)this);
    (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,uVar23,1,1);
    goto LAB_001159e6;
  }
  this = (ColoredMesh *)operator_new(200);
  ColoredMesh::ColoredMesh(this);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,uVar23,1,1);
  local_198._0_8_ = (ulong)(uint)local_198._4_4_ << 0x20;
  local_198.row = (uchar **)0x0;
  local_198.img = (uchar ***)0x0;
  local_198.n = 0;
  local_198.pixel = (uchar *)0x0;
  local_198.width = 0;
  local_198.height = 0;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_198,0,0,1);
  iVar11 = (int)((long)(local_f8.width + local_b8 + -1) / (long)local_b8);
  if (iVar11 < 2) {
    if ((local_f8.width < (long)local_b8) || (local_f8.height < local_b0)) {
      gimage::resizeImageBilinear<unsigned_char>(&local_78,&local_f8,local_b8,local_b0);
      goto LAB_00115848;
    }
  }
  else {
    gimage::downscaleImage<unsigned_char>(&local_78,&local_f8,iVar11);
LAB_00115848:
    pppuVar29 = local_198.img;
    lVar15 = local_198.n;
    lVar27 = local_198.height;
    lVar31 = local_198.width;
    iVar11 = local_198.depth;
    local_198.depth = local_78.depth;
    local_78.depth = iVar11;
    local_198.width = local_78.width;
    local_198.height = local_78.height;
    local_78.width = lVar31;
    local_78.height = lVar27;
    local_198.n = local_78.n;
    local_78.n = lVar15;
    puVar7 = (uchar *)CONCAT44(local_78.pixel._4_4_,local_78.pixel._0_4_);
    ppuVar13 = (uchar **)CONCAT44(local_78.row._4_4_,local_78.row._0_4_);
    local_78.pixel._0_4_ = local_198.pixel._0_4_;
    local_78.pixel._4_4_ = local_198.pixel._4_4_;
    local_78.row._0_4_ = local_198.row._0_4_;
    local_78.row._4_4_ = local_198.row._4_4_;
    local_198.img = local_78.img;
    local_78.img = pppuVar29;
    local_198.pixel = puVar7;
    local_198.row = ppuVar13;
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_78);
    pIVar21 = &local_198;
  }
  if (0 < pIVar21->height) {
    ppuVar13 = &this->rgb;
    lVar31 = 0;
    iVar11 = 0;
    do {
      if (0 < pIVar21->width) {
        lVar27 = 0;
        do {
          uVar23 = (ulong)(int)local_c0;
          bVar33 = (long)uVar23 < 1;
          if ((long)uVar23 < 1) {
LAB_0011593e:
            if (bVar33) {
              lVar15 = (long)iVar11 * 3;
              if (pIVar21->depth == 3) {
                (*ppuVar13)[lVar15] = (*pIVar21->img)[lVar31][lVar27];
                (*ppuVar13)[(long)(int)lVar15 + 1] = pIVar21->img[1][lVar31][lVar27];
                pppuVar29 = pIVar21->img + 2;
              }
              else {
                (*ppuVar13)[lVar15] = (*pIVar21->img)[lVar31][lVar27];
                (*ppuVar13)[lVar15 + 1] = (*pIVar21->img)[lVar31][lVar27];
                pppuVar29 = pIVar21->img;
              }
              (*ppuVar13)[lVar15 + 2] = (*pppuVar29)[lVar31][lVar27];
              iVar11 = iVar11 + 1;
            }
          }
          else if ((*(uint *)(*(long *)(*local_90 + lVar31 * 8) + lVar27 * 4) & 0x7fffffff) <
                   0x7f800000) {
            uVar28 = 1;
            do {
              uVar26 = uVar28;
              if (uVar23 == uVar26) break;
              uVar28 = uVar26 + 1;
            } while ((*(uint *)(*(long *)(local_90[uVar26] + lVar31 * 8) + lVar27 * 4) & 0x7fffffff)
                     < 0x7f800000);
            bVar33 = uVar23 <= uVar26;
            goto LAB_0011593e;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < pIVar21->width);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < pIVar21->height);
  }
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_198);
LAB_001159e6:
  lVar31 = 0x10;
  do {
    (this->super_Mesh).super_PointCloud.super_Model.origin.v[lVar31 + -0x10] =
         (double)local_88[lVar31];
    lVar31 = lVar31 + 1;
  } while (lVar31 != 0x13);
  cVar10 = (**(code **)(*local_88 + 0x18))(local_88);
  if (cVar10 != '\0') {
    plVar14 = local_88 + 7;
    pMVar17 = &(this->super_Mesh).super_PointCloud.super_Model.Rc;
    lVar31 = 0;
    do {
      lVar27 = 0;
      do {
        pMVar17->v[0][lVar27] = (double)plVar14[lVar27];
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      lVar31 = lVar31 + 1;
      pMVar17 = (Matrix33d *)(pMVar17->v + 1);
      plVar14 = plVar14 + 3;
    } while (lVar31 != 3);
    (this->super_Mesh).super_PointCloud.super_Model.Tc.v[0] = 0.0;
    (this->super_Mesh).super_PointCloud.super_Model.Tc.v[1] = 0.0;
    (this->super_Mesh).super_PointCloud.super_Model.Tc.v[2] = 0.0;
  }
  if (0 < local_b0) {
    lVar31 = 0;
    iVar11 = 0;
    do {
      if (0 < (long)local_b8) {
        local_138 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                    ((double)lVar31 + 0.5);
        lVar27 = 0;
        do {
          uVar23 = (ulong)(int)local_c0;
          bVar33 = (long)uVar23 < 1;
          if ((long)uVar23 < 1) {
LAB_00115b17:
            if (bVar33) {
              local_128._0_8_ = (double)lVar27 + 0.5;
              local_128._8_8_ = local_138;
              dVar5 = (double)*(float *)(*(long *)(*local_90 + lVar31 * 8) + lVar27 * 4);
              local_198.height = 0;
              local_198._0_8_ = (char *)0x0;
              local_198.width = 0;
              local_78.height = 0;
              local_78._0_8_ = (void *)0x0;
              local_78.width = 0;
              (**(code **)(*local_88 + 0x40))(local_88,&local_198,local_128);
              pfVar1 = (this->super_Mesh).super_PointCloud.vertex;
              lVar24 = (long)(iVar11 * 3);
              pfVar1[lVar24] = (float)((double)local_198._0_8_ - (double)local_88[0x10]);
              pfVar1[lVar24 + 1] = (float)((double)local_198.width - (double)local_88[0x11]);
              pfVar1[lVar24 + 2] = (float)((double)local_198.height - (double)local_88[0x12]);
              dVar6 = (double)local_128._8_8_ + 0.5;
              local_128._8_4_ = SUB84(dVar6,0);
              local_128._0_8_ = (double)local_128._0_8_ + 0.5;
              local_128._12_4_ = (int)((ulong)dVar6 >> 0x20);
              (**(code **)(*local_88 + 0x40))(SUB84(dVar5,0),local_88,&local_78,local_128);
              local_130 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(lVar24 + 1);
              local_158 = 0;
              uStack_150 = 0;
              local_148 = 0;
              lVar15 = 0;
              do {
                (&local_158)[lVar15] =
                     *(double *)(&local_78.depth + lVar15 * 2) -
                     *(double *)(&local_198.depth + lVar15 * 2);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              dVar6 = 0.0;
              lVar15 = 0;
              do {
                dVar6 = dVar6 + (double)(&local_158)[lVar15] * (double)(&local_158)[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              (this->super_Mesh).super_PointCloud.scanprop[lVar24] = (float)(dVar6 + dVar6);
              dVar6 = (double)local_128._8_8_ + -0.5;
              local_128._8_4_ = SUB84(dVar6,0);
              local_128._0_8_ = (double)local_128._0_8_ + -0.5;
              local_128._12_4_ = (int)((ulong)dVar6 >> 0x20);
              (**(code **)(*local_88 + 0x40))(SUB84(dVar5 + 0.5,0),local_88,&local_78,local_128);
              local_158 = 0;
              uStack_150 = 0;
              local_148 = 0;
              lVar15 = 0;
              do {
                (&local_158)[lVar15] =
                     *(double *)(&local_78.depth + lVar15 * 2) -
                     *(double *)(&local_198.depth + lVar15 * 2);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              dVar5 = 0.0;
              lVar15 = 0;
              do {
                dVar5 = dVar5 + (double)(&local_158)[lVar15] * (double)(&local_158)[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              if (dVar5 < 0.0) {
                dVar5 = sqrt(dVar5);
              }
              else {
                dVar5 = SQRT(dVar5);
              }
              pfVar1 = (this->super_Mesh).super_PointCloud.scanprop;
              pfVar1[lVar24 + 1] = (float)dVar5;
              pfVar1[lVar24 + 2] = 1.0;
              pfVar1 = (this->super_Mesh).super_PointCloud.scanpos;
              pfVar1[lVar24] = 0.0;
              pfVar1[(long)local_130] = 0.0;
              pfVar1[lVar24 + 2] = 0.0;
              iVar11 = iVar11 + 1;
            }
          }
          else if ((*(uint *)(*(long *)(*local_90 + lVar31 * 8) + lVar27 * 4) & 0x7fffffff) <
                   0x7f800000) {
            uVar28 = 1;
            do {
              uVar26 = uVar28;
              if (uVar23 == uVar26) break;
              uVar28 = uVar26 + 1;
            } while ((*(uint *)(*(long *)(local_90[uVar26] + lVar31 * 8) + lVar27 * 4) & 0x7fffffff)
                     < 0x7f800000);
            bVar33 = uVar23 <= uVar26;
            goto LAB_00115b17;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < (long)local_b8);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < local_b0);
  }
  uVar23 = 0;
  if (1 < local_b0) {
    lVar31 = 1;
    uVar23 = 0;
    do {
      if (1 < (long)local_b8) {
        sVar30 = 1;
        do {
          iVar11 = 0;
          fVar34 = 3.4028235e+38;
          fVar36 = -3.4028235e+38;
          lVar27 = 0;
          do {
            lVar24 = lVar31 - lVar27;
            lVar15 = 0;
            do {
              lVar25 = sVar30 - lVar15;
              bVar33 = (int)local_c0 < 1;
              if ((int)local_c0 < 1) {
LAB_00115ea2:
                if (bVar33) {
                  fVar35 = *(float *)(*(long *)(*local_90 + lVar24 * 8) + lVar25 * 4);
                  fVar8 = fVar35;
                  if (fVar34 <= fVar35) {
                    fVar8 = fVar34;
                  }
                  fVar34 = fVar8;
                  if (fVar35 <= fVar36) {
                    fVar35 = fVar36;
                  }
                  iVar11 = iVar11 + 1;
                  fVar36 = fVar35;
                }
              }
              else if ((*(uint *)(*(long *)(*local_90 + lVar24 * 8) + lVar25 * 4) & 0x7fffffff) <
                       0x7f800000) {
                uVar28 = 1;
                do {
                  uVar26 = uVar28;
                  if (local_c0 == uVar26) break;
                  uVar28 = uVar26 + 1;
                } while ((*(uint *)(*(long *)(local_90[uVar26] + lVar24 * 8) + lVar25 * 4) &
                         0x7fffffff) < 0x7f800000);
                bVar33 = local_c0 <= uVar26;
                goto LAB_00115ea2;
              }
              bVar33 = lVar15 == 0;
              lVar15 = lVar15 + 1;
            } while (bVar33);
            bVar33 = lVar27 == 0;
            lVar27 = lVar27 + 1;
          } while (bVar33);
          iVar12 = iVar11 + -2;
          if (local_19c < fVar36 - fVar34) {
            iVar12 = 0;
          }
          if (iVar11 < 3) {
            iVar12 = 0;
          }
          uVar23 = (ulong)(uint)((int)uVar23 + iVar12);
          sVar30 = sVar30 + 1;
        } while (sVar30 != local_b8);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != local_b0);
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this,uVar23);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_198,local_b8,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_78,local_b8,(allocator_type *)&local_158);
  if ((long)local_b8 < 1) {
    local_1a8 = 0;
  }
  else {
    uVar23 = 0;
    local_1a8 = 0;
    do {
      if (uVar23 == local_78.width - local_78._0_8_ >> 2) goto LAB_00116443;
      *(undefined4 *)(local_78._0_8_ + uVar23 * 4) = 0xffffffff;
      uVar28 = (ulong)(int)local_c0;
      bVar33 = (long)uVar28 < 1;
      if ((long)uVar28 < 1) {
LAB_00116015:
        if (bVar33) {
          *(int *)(local_78._0_8_ + uVar23 * 4) = local_1a8;
          local_1a8 = local_1a8 + 1;
        }
      }
      else if ((*(uint *)(*(long *)*local_90 + uVar23 * 4) & 0x7fffffff) < 0x7f800000) {
        uVar26 = 1;
        do {
          uVar20 = uVar26;
          if (uVar28 == uVar20) break;
          uVar26 = uVar20 + 1;
        } while ((*(uint *)(*(long *)local_90[uVar20] + uVar23 * 4) & 0x7fffffff) < 0x7f800000);
        bVar33 = uVar28 <= uVar20;
        goto LAB_00116015;
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_b8);
  }
  local_38 = local_b0;
  if (1 < local_b0) {
    iVar11 = 0;
    lVar31 = 1;
    local_40 = local_90;
    pIVar21 = &local_198;
    pIVar32 = &local_78;
    do {
      local_138 = pIVar32;
      piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar21->depth)->_M_impl).
               super__Vector_impl_data._M_start;
      if ((pointer)pIVar21->width == piVar2) goto LAB_00116451;
      *piVar2 = -1;
      uVar23 = (ulong)(int)local_c0;
      bVar33 = (long)uVar23 < 1;
      if ((long)uVar23 < 1) {
LAB_001160ed:
        if (bVar33) {
          *piVar2 = local_1a8;
          local_1a8 = local_1a8 + 1;
        }
      }
      else if ((**(uint **)(*local_90 + lVar31 * 8) & 0x7fffffff) < 0x7f800000) {
        uVar28 = 1;
        do {
          uVar26 = uVar28;
          if (uVar23 == uVar26) break;
          uVar28 = uVar26 + 1;
        } while ((**(uint **)(local_90[uVar26] + lVar31 * 8) & 0x7fffffff) < 0x7f800000);
        bVar33 = uVar23 <= uVar26;
        goto LAB_001160ed;
      }
      pIVar22 = pIVar21;
      if (1 < (long)local_b8) {
        uVar23 = 1;
        local_130 = pIVar21;
        do {
          piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar22->depth)->_M_impl).
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)pIVar22->width - (long)piVar2 >> 2) <= uVar23) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar23);
            uVar28 = uVar23;
            uVar26 = extraout_RDX;
LAB_00116432:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar28,uVar26);
            goto LAB_00116443;
          }
          piVar2[uVar23] = -1;
          uVar28 = (ulong)(int)local_c0;
          bVar33 = (long)uVar28 < 1;
          if ((long)uVar28 < 1) {
LAB_00116197:
            if (bVar33) {
              piVar2[uVar23] = local_1a8;
              local_1a8 = local_1a8 + 1;
            }
          }
          else if ((*(uint *)(*(long *)(*local_90 + lVar31 * 8) + uVar23 * 4) & 0x7fffffff) <
                   0x7f800000) {
            uVar26 = 1;
            do {
              uVar20 = uVar26;
              if (uVar28 == uVar20) break;
              uVar26 = uVar20 + 1;
            } while ((*(uint *)(*(long *)(local_90[uVar20] + lVar31 * 8) + uVar23 * 4) & 0x7fffffff)
                     < 0x7f800000);
            bVar33 = uVar28 <= uVar20;
            goto LAB_00116197;
          }
          iVar12 = 0;
          fVar36 = -3.4028235e+38;
          fVar34 = 3.4028235e+38;
          lVar27 = 0;
          do {
            lVar24 = lVar31 - lVar27;
            lVar15 = 0;
            fVar35 = fVar36;
            do {
              lVar25 = uVar23 - lVar15;
              bVar33 = (int)local_c0 < 1;
              fVar36 = fVar35;
              if ((int)local_c0 < 1) {
LAB_00116222:
                if (bVar33) {
                  fVar36 = *(float *)(*(long *)(*local_90 + lVar24 * 8) + lVar25 * 4);
                  fVar8 = fVar36;
                  if (fVar34 <= fVar36) {
                    fVar8 = fVar34;
                  }
                  fVar34 = fVar8;
                  if (fVar36 <= fVar35) {
                    fVar36 = fVar35;
                  }
                  iVar12 = iVar12 + 1;
                }
              }
              else if ((*(uint *)(*(long *)(*local_90 + lVar24 * 8) + lVar25 * 4) & 0x7fffffff) <
                       0x7f800000) {
                uVar28 = 1;
                do {
                  uVar26 = uVar28;
                  if (local_c0 == uVar26) break;
                  uVar28 = uVar26 + 1;
                } while ((*(uint *)(*(long *)(local_90[uVar26] + lVar24 * 8) + lVar25 * 4) &
                         0x7fffffff) < 0x7f800000);
                bVar33 = local_c0 <= uVar26;
                goto LAB_00116222;
              }
              bVar33 = lVar15 == 0;
              lVar15 = lVar15 + 1;
              fVar35 = fVar36;
            } while (bVar33);
            bVar33 = lVar27 == 0;
            lVar27 = lVar27 + 1;
          } while (bVar33);
          iVar9 = iVar11;
          if ((2 < iVar12) && (fVar36 - fVar34 <= local_19c)) {
            uVar28 = uVar23 - 1;
            piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar32->depth)->_M_impl).
                     super__Vector_impl_data._M_start;
            uVar20 = (long)pIVar32->width - (long)piVar2 >> 2;
            uVar26 = uVar20;
            if (uVar28 < uVar20) {
              bVar33 = -1 < piVar2[uVar23 - 1];
              if (bVar33) {
                local_158 = CONCAT44(local_158._4_4_,piVar2[uVar23 - 1]);
              }
              piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&pIVar21->depth)->_M_impl).
                       super__Vector_impl_data._M_start;
              uVar26 = (long)pIVar21->width - (long)piVar3 >> 2;
              if (uVar28 < uVar26) {
                uVar18 = (ulong)bVar33;
                if (-1 < piVar3[uVar23 - 1]) {
                  uVar18 = (ulong)(bVar33 + 1);
                  *(int *)((long)&local_158 + (ulong)bVar33 * 4) = piVar3[uVar23 - 1];
                }
                uVar28 = uVar23;
                if (uVar23 < uVar26) {
                  uVar19 = uVar18;
                  if (-1 < piVar3[uVar23]) {
                    uVar19 = (ulong)((int)uVar18 + 1);
                    *(int *)((long)&local_158 + uVar18 * 4) = piVar3[uVar23];
                  }
                  uVar26 = uVar20;
                  if (uVar23 < uVar20) {
                    uVar28 = uVar19;
                    if (-1 < piVar2[uVar23]) {
                      uVar28 = (ulong)((int)uVar19 + 1);
                      *(int *)((long)&local_158 + uVar19 * 4) = piVar2[uVar23];
                    }
                    puVar4 = (this->super_Mesh).triangle;
                    puVar4[iVar11 * 3] = (uint)local_158;
                    (puVar4 + iVar11 * 3)[1] = local_158._4_4_;
                    puVar4[(long)(iVar11 * 3) + 2] = (uint)uStack_150;
                    iVar9 = iVar11 + 1;
                    if ((int)uVar28 == 4) {
                      lVar27 = (long)((iVar11 + 1) * 3);
                      puVar4[lVar27] = (uint)uStack_150;
                      puVar4[lVar27 + 1] = uStack_150._4_4_;
                      puVar4[lVar27 + 2] = (uint)local_158;
                      iVar9 = iVar11 + 2;
                    }
                    goto LAB_00116382;
                  }
                }
              }
            }
            goto LAB_00116432;
          }
LAB_00116382:
          iVar11 = iVar9;
          uVar23 = uVar23 + 1;
          pIVar22 = local_130;
        } while (uVar23 != local_b8);
      }
      lVar31 = lVar31 + 1;
      pIVar21 = local_138;
      pIVar32 = pIVar22;
    } while (lVar31 != local_b0);
  }
  Mesh::recalculateNormals(&this->super_Mesh);
  if ((void *)local_78._0_8_ != (void *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((char *)local_198._0_8_ != (char *)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  gimage::View::~View((View *)&local_f8);
  return (Model *)this;
LAB_00116443:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00116451:
  uVar16 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  gimage::View::~View((View *)&local_f8);
  _Unwind_Resume(uVar16);
}

Assistant:

Model *loadDepth(const char *name, const char *spath, bool verbose)
{
  // load view

  gimage::View view;
  loadView(view, name, spath, verbose);

  // read optional maximum step size parameter

  float dstep=view.getDepthStep();

  std::vector<std::string> list;
  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "s=") == 0)
    {
      dstep=static_cast<float>(atof(list[i].substr(2).c_str()));
    }
  }

  // determine the number of valid points

  const gimage::ImageFloat &depth=view.getDepthImage();

  int n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        n++;
      }
    }
  }

  // create mesh

  Mesh *mesh=0;
  const gimage::ImageU8 *image=&view.getImage();

  if (image->getWidth() > 0 && image->getHeight() > 0)
  {
    ColoredMesh *cmesh=new ColoredMesh();
    cmesh->resizeVertexList(n, true, true);

    // resize image if required

    gimage::ImageU8 dsimage;

    {
      int ds=(image->getWidth()+depth.getWidth()-1)/depth.getWidth();

      if (ds > 1)
      {
        dsimage=gimage::downscaleImage(*image, ds);
        image=&dsimage;
      }
      else if (image->getWidth() < depth.getWidth() || image->getHeight() < depth.getHeight())
      {
        dsimage=gimage::resizeImageBilinear(*image, depth.getWidth(), depth.getHeight());
        image=&dsimage;
      }
    }

    // store colors

    n=0;

    for (long k=0; k<image->getHeight(); k++)
    {
      for (long i=0; i<image->getWidth(); i++)
      {
        if (depth.isValid(i, k))
        {
          if (image->getDepth() == 3)
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 1));
            cmesh->setColorComp(n, 2, image->get(i, k, 2));
          }
          else
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 0));
            cmesh->setColorComp(n, 2, image->get(i, k, 0));
          }

          n++;
        }
      }
    }

    mesh=cmesh;
  }
  else
  {
    mesh=new Mesh();
    mesh->resizeVertexList(n, true, true);
  }

  // reconstruct and store vertices

  const gmath::Camera *cam=view.getCamera();

  mesh->setOrigin(cam->getT());

  if (cam->isPerspective())
  {
    mesh->setDefCameraRT(cam->getR(), gmath::Vector3d());
  }

  n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        gmath::Vector2d p(i+0.5, k+0.5);
        double   d=depth.get(i, k);
        gmath::Vector3d P, P2;

        cam->reconstructPoint(P, p, d);

        mesh->setVertexComp(n, 0, static_cast<float>(P[0]-cam->getT()[0]));
        mesh->setVertexComp(n, 1, static_cast<float>(P[1]-cam->getT()[1]));
        mesh->setVertexComp(n, 2, static_cast<float>(P[2]-cam->getT()[2]));

        p[0]+=0.5;
        p[1]+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanSize(n, static_cast<float>(2*norm(P2-P)));

        p[0]-=0.5;
        p[1]-=0.5;
        d+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanError(n, static_cast<float>(norm(P2-P)));
        mesh->setScanConf(n, 1.0f);

        mesh->setScanPosComp(n, 0, 0.0f);
        mesh->setScanPosComp(n, 1, 0.0f);
        mesh->setScanPosComp(n, 2, 0.0f);

        n++;
      }
    }
  }

  // count number of triangles

  int tn=0;

  for (long k=1; k<depth.getHeight(); k++)
  {
    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        tn+=valid-2;
      }
    }
  }

  mesh->resizeTriangleList(tn);

  // create triangles

  std::vector<int> line0(depth.getWidth());
  std::vector<int> line1(depth.getWidth());
  std::vector<int> *l0=&line0;
  std::vector<int> *l1=&line1;

  n=0;
  tn=0;

  for (long i=0; i<depth.getWidth(); i++)
  {
    l1->at(i)=-1;

    if (depth.isValid(i, 0))
    {
      l1->at(i)=n++;
    }
  }

  for (long k=1; k<depth.getHeight(); k++)
  {
    std::vector<int> *t=l0;
    l0=l1;
    l1=t;

    l1->at(0)=-1;

    if (depth.isValid(0, k))
    {
      l1->at(0)=n++;
    }

    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      l1->at(i)=-1;

      if (depth.isValid(i, k))
      {
        l1->at(i)=n++;
      }

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        int j=0;
        int f[4];

        if (l0->at(i-1) >= 0)
        {
          f[j++]=l0->at(i-1);
        }

        if (l1->at(i-1) >= 0)
        {
          f[j++]=l1->at(i-1);
        }

        if (l1->at(i) >= 0)
        {
          f[j++]=l1->at(i);
        }

        if (l0->at(i) >= 0)
        {
          f[j++]=l0->at(i);
        }

        mesh->setTriangleIndex(tn, 0, f[0]);
        mesh->setTriangleIndex(tn, 1, f[1]);
        mesh->setTriangleIndex(tn, 2, f[2]);
        tn++;

        if (j == 4)
        {
          mesh->setTriangleIndex(tn, 0, f[2]);
          mesh->setTriangleIndex(tn, 1, f[3]);
          mesh->setTriangleIndex(tn, 2, f[0]);
          tn++;
        }
      }
    }
  }

  // compute normals

  mesh->recalculateNormals();

  return mesh;
}